

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O1

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addArgWithFlagAndName<char_const(&)[6]>
          (API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
           *this,Char flag,char (*name) [6],bool isWithValue,bool isRequired,String *desc,
          String *longDesc,String *defaultValue,String *valueSpecifier)

{
  Arg *this_00;
  
  this_00 = (Arg *)operator_new(0xf8);
  Arg::Arg<char_const(&)[6]>(this_00,flag,name,isWithValue,isRequired);
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if (defaultValue->_M_string_length != 0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[0x16])(this_00);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  (**(code **)(**(long **)(this + 0x10) + 0x98))();
  if (this_00 != (Arg *)0x0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[1])();
  }
  return (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
          *)this;
}

Assistant:

API< PARENT, Command, ARGPTR, false > & addArgWithFlagAndName(
		//! Flag for this argument.
		Char flag,
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< Arg, details::Deleter< ArgIface > > (
			new Arg( flag, std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}